

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

learner<svm_params,_example> *
LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
          (free_ptr<svm_params> *dat,
          _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  learner<svm_params,_example> *plVar1;
  unique_ptr<svm_params,_void_(*)(void_*)> *in_RCX;
  _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *in_RDX;
  _func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *in_RSI;
  learner<char,_example> *in_RDI;
  learner<svm_params,_example> *ret;
  undefined8 in_stack_ffffffffffffffd8;
  prediction_type_t pred_type;
  
  pred_type = (prediction_type_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::get(in_RCX);
  plVar1 = learner<svm_params,example>::init_learner<LEARNER::learner<char,example>>
                     ((svm_params *)ret,in_RDI,in_RSI,in_RDX,(size_t)in_RCX,pred_type);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::release
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x32705e);
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}